

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

shared_ptr<dap::ReaderWriter> __thiscall dap::file(dap *this,FILE *f,bool closable)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar1;
  shared_ptr<dap::ReaderWriter> sVar2;
  
  puVar1 = (undefined8 *)operator_new(0x88);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00a1a150;
  puVar1[2] = &PTR__File_00a1a1c0;
  puVar1[3] = &PTR__File_00a1a220;
  puVar1[4] = f;
  *(bool *)(puVar1 + 5) = closable;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  *(undefined1 *)(puVar1 + 0x10) = 0;
  *(undefined8 **)this = puVar1 + 2;
  *(undefined8 **)(this + 8) = puVar1;
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__File_00a1a220;
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> file(FILE* f, bool closable /* = true */) {
  return std::make_shared<File>(f, closable);
}